

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathColorAlgo.cpp
# Opt level: O3

Color4<double> * Imath_3_2::hsv2rgb_d(Color4<double> *__return_storage_ptr__,Color4<double> *hsv)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar5 = hsv->g;
  dVar1 = hsv->b;
  dVar4 = (double)(~-(ulong)(hsv->r == 1.0) & (ulong)(hsv->r * 6.0));
  dVar2 = floor(dVar4);
  if ((uint)(int)dVar2 < 6) {
    dVar4 = dVar4 - (double)(int)dVar2;
    dVar3 = (1.0 - dVar5) * dVar1;
    dVar6 = (1.0 - dVar5 * dVar4) * dVar1;
    dVar7 = (1.0 - (1.0 - dVar4) * dVar5) * dVar1;
    dVar5 = dVar1;
    dVar4 = dVar1;
    switch((int)dVar2) {
    case 0:
      dVar5 = dVar3;
      dVar4 = dVar7;
      dVar3 = dVar1;
      break;
    case 1:
      dVar5 = dVar3;
      dVar3 = dVar6;
      break;
    case 2:
      dVar5 = dVar7;
      break;
    case 3:
      dVar4 = dVar6;
      break;
    case 4:
      dVar4 = dVar3;
      dVar3 = dVar7;
      break;
    case 5:
      dVar5 = dVar6;
      dVar4 = dVar3;
      dVar3 = dVar1;
    }
  }
  else {
    dVar5 = 0.0;
    dVar4 = 0.0;
    dVar3 = 0.0;
  }
  dVar1 = hsv->a;
  __return_storage_ptr__->r = dVar3;
  __return_storage_ptr__->g = dVar4;
  __return_storage_ptr__->b = dVar5;
  __return_storage_ptr__->a = dVar1;
  return __return_storage_ptr__;
}

Assistant:

Color4<double>
hsv2rgb_d (const Color4<double>& hsv) IMATH_NOEXCEPT
{
    double hue = hsv.r;
    double sat = hsv.g;
    double val = hsv.b;

    double r = 0.0, g = 0.0, b = 0.0;

    if (hue == 1)
        hue = 0;
    else
        hue *= 6;

    int    i = int (std::floor (hue));
    double f = hue - i;
    double p = val * (1 - sat);
    double q = val * (1 - (sat * f));
    double t = val * (1 - (sat * (1 - f)));

    switch (i)
    {
        case 0:
            r = val;
            g = t;
            b = p;
            break;
        case 1:
            r = q;
            g = val;
            b = p;
            break;
        case 2:
            r = p;
            g = val;
            b = t;
            break;
        case 3:
            r = p;
            g = q;
            b = val;
            break;
        case 4:
            r = t;
            g = p;
            b = val;
            break;
        case 5:
            r = val;
            g = p;
            b = q;
            break;
    }

    return Color4<double> (r, g, b, hsv.a);
}